

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstm.cpp
# Opt level: O2

int ncnn::lstm_int8(Mat *bottom_blob,Mat *top_blob,int reverse,Mat *weight_xc_int8,
                   float *weight_xc_int8_scales,Mat *bias_c,Mat *weight_hc_int8,
                   float *weight_hc_int8_scales,Mat *weight_hr,Mat *hidden_state,Mat *cell_state,
                   Option *opt)

{
  float fVar1;
  uint _h;
  uint _w;
  uint _h_00;
  size_t sVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [14];
  undefined1 auVar6 [14];
  undefined1 auVar7 [14];
  undefined1 auVar8 [14];
  undefined4 uVar9;
  undefined1 uVar10;
  undefined1 uVar12;
  undefined1 uVar14;
  undefined1 uVar16;
  undefined4 uVar17;
  undefined1 uVar18;
  undefined1 uVar20;
  undefined1 uVar22;
  undefined1 uVar24;
  undefined4 uVar25;
  undefined1 uVar26;
  undefined1 uVar28;
  undefined1 uVar30;
  undefined1 uVar32;
  undefined8 uVar33;
  int *piVar40;
  undefined1 auVar41 [14];
  undefined1 auVar42 [14];
  void *pvVar43;
  long lVar44;
  long lVar45;
  void *pvVar46;
  void *pvVar47;
  long lVar48;
  ulong uVar49;
  uint uVar50;
  long lVar51;
  long lVar52;
  void *pvVar53;
  int iVar54;
  int iVar55;
  ulong uVar56;
  ulong uVar57;
  long lVar58;
  void *pvVar59;
  ulong uVar60;
  void *pvVar61;
  ulong uVar62;
  void *pvVar63;
  void *pvVar64;
  void *pvVar65;
  uint uVar66;
  long lVar67;
  ulong uVar68;
  void *pvVar69;
  float *pfVar70;
  float absmax;
  float fVar71;
  float fVar72;
  float fVar73;
  float fVar74;
  int iVar75;
  int iVar77;
  int iVar78;
  int iVar79;
  undefined1 auVar76 [16];
  int iVar81;
  int iVar82;
  int iVar83;
  undefined1 auVar80 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  Mat local_258;
  Mat local_208;
  Option opt_quant;
  Mat local_168;
  Mat local_118;
  Mat local_c8;
  Option opt_quant_1;
  undefined4 uVar11;
  undefined3 uVar13;
  undefined2 uVar15;
  undefined4 uVar19;
  undefined3 uVar21;
  undefined2 uVar23;
  undefined4 uVar27;
  undefined3 uVar29;
  undefined2 uVar31;
  undefined1 uVar34;
  undefined1 uVar35;
  undefined3 uVar36;
  undefined1 uVar37;
  undefined2 uVar38;
  undefined1 uVar39;
  
  uVar50 = bottom_blob->w;
  _h = bottom_blob->h;
  _w = top_blob->w;
  _h_00 = cell_state->w;
  local_208.cstep = 0;
  local_208.data = (void *)0x0;
  local_208.refcount._0_4_ = 0;
  local_208.refcount._4_4_ = 0;
  local_208.elemsize._0_4_ = 0;
  local_208.elemsize._4_4_ = 0;
  local_208.elempack = 0;
  local_208.allocator = (Allocator *)0x0;
  local_208.dims = 0;
  local_208.w = 0;
  local_208.h = 0;
  local_208.d = 0;
  local_208.c = 0;
  Mat::create(&local_208,4,_h_00,4,opt->workspace_allocator);
  iVar75 = -100;
  if ((local_208.data == (void *)0x0) || ((long)local_208.c * local_208.cstep == 0))
  goto LAB_00321af5;
  local_258.cstep = 0;
  local_258.data = (void *)0x0;
  local_258.refcount._0_4_ = 0;
  local_258.refcount._4_4_ = 0;
  local_258.elemsize._0_4_ = 0;
  local_258._20_8_ = 0;
  local_258.allocator = (Allocator *)0x0;
  local_258.dims = 0;
  local_258.w = 0;
  local_258.h = 0;
  local_258.d = 0;
  local_258.c = 0;
  if (_w == _h_00) {
LAB_0032117a:
    local_118.cstep = 0;
    local_118.data = (void *)0x0;
    local_118.refcount._0_4_ = 0;
    local_118.refcount._4_4_ = 0;
    local_118.elemsize._0_4_ = 0;
    local_118.elemsize._4_4_ = 0;
    local_118.elempack = 0;
    local_118.allocator = (Allocator *)0x0;
    local_118.dims = 0;
    local_118.w = 0;
    local_118.h = 0;
    local_118.d = 0;
    local_118.c = 0;
    Mat::create(&local_118,uVar50,_h,1,1,opt->workspace_allocator);
    local_c8.cstep = 0;
    local_c8.data = (void *)0x0;
    local_c8.refcount._0_4_ = 0;
    local_c8.refcount._4_4_ = 0;
    local_c8.elemsize._0_4_ = 0;
    local_c8._20_8_ = 0;
    local_c8.allocator = (Allocator *)0x0;
    local_c8.dims = 0;
    local_c8.w = 0;
    local_c8.h = 0;
    local_c8.d = 0;
    local_c8.c = 0;
    Mat::create(&local_c8,_h,4,1,opt->workspace_allocator);
    lVar44 = (long)(int)_h_00;
    iVar75 = bottom_blob->w;
    sVar2 = bottom_blob->elemsize;
    pvVar47 = bottom_blob->data;
    uVar57 = 0;
    uVar56 = (ulong)uVar50;
    if ((int)uVar50 < 1) {
      uVar56 = uVar57;
    }
    uVar68 = 0;
    if (0 < (int)_h) {
      uVar68 = (ulong)_h;
    }
    for (; uVar57 != uVar68; uVar57 = uVar57 + 1) {
      fVar71 = 0.0;
      for (uVar60 = 0; uVar56 != uVar60; uVar60 = uVar60 + 1) {
        fVar74 = ABS(*(float *)((long)pvVar47 + uVar60 * 4));
        if (fVar71 <= fVar74) {
          fVar71 = fVar74;
        }
      }
      *(float *)((long)local_c8.data + uVar57 * 4) = 127.0 / fVar71;
      pvVar47 = (void *)((long)pvVar47 + (long)iVar75 * sVar2);
    }
    opt_quant.lightmode = opt->lightmode;
    opt_quant.use_shader_pack8 = opt->use_shader_pack8;
    opt_quant.use_subgroup_ops = opt->use_subgroup_ops;
    opt_quant.use_reserved_0 = opt->use_reserved_0;
    opt_quant.num_threads = opt->num_threads;
    uVar9 = opt->openmp_blocktime;
    uVar10 = opt->use_winograd_convolution;
    uVar12 = opt->use_sgemm_convolution;
    uVar14 = opt->use_int8_inference;
    uVar16 = opt->use_vulkan_compute;
    uVar15 = CONCAT11(uVar16,uVar14);
    uVar13 = CONCAT21(uVar15,uVar12);
    uVar11 = CONCAT31(uVar13,uVar10);
    uVar57._0_1_ = opt->use_bf16_storage;
    uVar57._1_1_ = opt->use_fp16_packed;
    uVar57._2_1_ = opt->use_fp16_storage;
    uVar57._3_1_ = opt->use_fp16_arithmetic;
    uVar57._4_1_ = opt->use_int8_packed;
    uVar57._5_1_ = opt->use_int8_storage;
    uVar57._6_1_ = opt->use_int8_arithmetic;
    uVar57._7_1_ = opt->use_packing_layout;
    uVar17 = opt->vulkan_device_index;
    uVar18 = opt->use_reserved_1;
    uVar20 = opt->use_image_storage;
    uVar22 = opt->use_tensor_storage;
    uVar24 = opt->use_reserved_2;
    uVar23 = CONCAT11(uVar24,uVar22);
    uVar21 = CONCAT21(uVar23,uVar20);
    uVar19 = CONCAT31(uVar21,uVar18);
    uVar25 = opt->flush_denormals;
    uVar26 = opt->use_local_pool_allocator;
    uVar28 = opt->use_shader_local_memory;
    uVar30 = opt->use_cooperative_matrix;
    uVar32 = opt->use_winograd23_convolution;
    uVar31 = CONCAT11(uVar32,uVar30);
    uVar29 = CONCAT21(uVar31,uVar28);
    uVar27 = CONCAT31(uVar29,uVar26);
    uVar33._0_1_ = opt->use_winograd43_convolution;
    uVar33._1_1_ = opt->use_winograd63_convolution;
    uVar33._2_1_ = opt->use_a53_a55_optimized_kernel;
    uVar33._3_1_ = opt->use_fp16_uniform;
    uVar34 = opt->use_int8_uniform;
    uVar35 = opt->use_reserved_9;
    uVar37 = opt->use_reserved_10;
    uVar39 = opt->use_reserved_11;
    uVar38 = CONCAT11(uVar39,uVar37);
    uVar36 = CONCAT21(uVar38,uVar35);
    uVar33._4_4_ = CONCAT31(uVar36,uVar34);
    opt_quant._56_4_ = SUB84(uVar33,0);
    opt_quant.workspace_allocator._0_4_ = SUB84(opt->workspace_allocator,0);
    opt_quant.workspace_allocator._4_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
    opt_quant.blob_allocator._0_4_ = SUB84(opt->workspace_allocator,0);
    opt_quant.blob_allocator._4_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
    opt_quant._32_8_ = uVar57 & 0xffffffffffffff;
    opt_quant.openmp_blocktime = uVar9;
    opt_quant._28_4_ = uVar11;
    opt_quant.vulkan_device_index = uVar17;
    opt_quant._44_4_ = uVar19;
    opt_quant.flush_denormals = uVar25;
    opt_quant._52_4_ = uVar27;
    opt_quant._60_4_ = uVar33._4_4_;
    quantize_to_int8(bottom_blob,&local_118,&local_c8,&opt_quant);
    opt_quant.lightmode = false;
    opt_quant.use_shader_pack8 = false;
    opt_quant.use_subgroup_ops = false;
    opt_quant.use_reserved_0 = false;
    opt_quant.num_threads = 0;
    opt_quant.blob_allocator._0_4_ = 0;
    opt_quant.blob_allocator._4_4_ = 0;
    opt_quant.workspace_allocator._0_4_ = 0;
    opt_quant.workspace_allocator._4_4_ = 0;
    opt_quant.openmp_blocktime = 0;
    opt_quant.use_bf16_storage = false;
    opt_quant.use_fp16_packed = false;
    opt_quant.use_fp16_storage = false;
    opt_quant.use_fp16_arithmetic = false;
    opt_quant.use_int8_packed = false;
    opt_quant.use_int8_storage = false;
    opt_quant.use_int8_arithmetic = false;
    opt_quant.use_packing_layout = false;
    opt_quant.vulkan_device_index = 0;
    opt_quant.use_reserved_1 = false;
    opt_quant.use_image_storage = false;
    opt_quant.use_tensor_storage = false;
    opt_quant.use_reserved_2 = false;
    opt_quant.flush_denormals = 0;
    opt_quant.use_local_pool_allocator = false;
    opt_quant.use_shader_local_memory = false;
    opt_quant.use_cooperative_matrix = false;
    opt_quant.use_winograd23_convolution = false;
    opt_quant.use_winograd43_convolution = false;
    opt_quant.use_winograd63_convolution = false;
    opt_quant.use_a53_a55_optimized_kernel = false;
    opt_quant.use_fp16_uniform = false;
    Mat::create((Mat *)&opt_quant,_w,1,1,opt->workspace_allocator);
    local_168.cstep = 0;
    local_168.data = (float *)0x0;
    local_168.refcount._0_4_ = 0;
    local_168.refcount._4_4_ = 0;
    local_168.elemsize._0_4_ = 0;
    local_168._20_8_ = 0;
    local_168.allocator = (Allocator *)0x0;
    local_168.dims = 0;
    local_168.w = 0;
    local_168.h = 0;
    local_168.d = 0;
    local_168.c = 0;
    Mat::create(&local_168,1,4,1,opt->workspace_allocator);
    uVar57 = 0;
    if (0 < (int)_w) {
      uVar57 = (ulong)_w;
    }
    lVar48 = (long)(int)(_h_00 * 3);
    lVar45 = (long)(int)(_h_00 * 2);
    uVar60 = 0;
    if (0 < (int)_h_00) {
      uVar60 = (ulong)_h_00;
    }
    for (uVar50 = 0; uVar50 != (uint)uVar68; uVar50 = uVar50 + 1) {
      fVar71 = 0.0;
      for (uVar49 = 0; uVar57 != uVar49; uVar49 = uVar49 + 1) {
        fVar74 = ABS(*(float *)((long)hidden_state->data + uVar49 * 4));
        if (fVar71 <= fVar74) {
          fVar71 = fVar74;
        }
      }
      uVar66 = ~uVar50 + _h;
      if (reverse == 0) {
        uVar66 = uVar50;
      }
      if (fVar71 == 0.0) {
        *(float *)local_168.data = 1.0;
        for (lVar51 = 0; lVar51 != 0; lVar51 = lVar51 + 1) {
          *(undefined1 *)(opt_quant._0_8_ + lVar51) = 0;
        }
      }
      else {
        *(float *)local_168.data = 127.0 / fVar71;
        opt_quant_1.lightmode = opt->lightmode;
        opt_quant_1.use_shader_pack8 = opt->use_shader_pack8;
        opt_quant_1.use_subgroup_ops = opt->use_subgroup_ops;
        opt_quant_1.use_reserved_0 = opt->use_reserved_0;
        opt_quant_1.num_threads = opt->num_threads;
        opt_quant_1.workspace_allocator = opt->workspace_allocator;
        opt_quant_1.openmp_blocktime = opt->openmp_blocktime;
        opt_quant_1.use_winograd_convolution = opt->use_winograd_convolution;
        opt_quant_1.use_sgemm_convolution = opt->use_sgemm_convolution;
        opt_quant_1.use_int8_inference = opt->use_int8_inference;
        opt_quant_1.use_vulkan_compute = opt->use_vulkan_compute;
        uVar49._0_1_ = opt->use_bf16_storage;
        uVar49._1_1_ = opt->use_fp16_packed;
        uVar49._2_1_ = opt->use_fp16_storage;
        uVar49._3_1_ = opt->use_fp16_arithmetic;
        uVar49._4_1_ = opt->use_int8_packed;
        uVar49._5_1_ = opt->use_int8_storage;
        uVar49._6_1_ = opt->use_int8_arithmetic;
        uVar49._7_1_ = opt->use_packing_layout;
        opt_quant_1.vulkan_device_index = opt->vulkan_device_index;
        opt_quant_1.use_reserved_1 = opt->use_reserved_1;
        opt_quant_1.use_image_storage = opt->use_image_storage;
        opt_quant_1.use_tensor_storage = opt->use_tensor_storage;
        opt_quant_1.use_reserved_2 = opt->use_reserved_2;
        opt_quant_1.flush_denormals = opt->flush_denormals;
        opt_quant_1.use_local_pool_allocator = opt->use_local_pool_allocator;
        opt_quant_1.use_shader_local_memory = opt->use_shader_local_memory;
        opt_quant_1.use_cooperative_matrix = opt->use_cooperative_matrix;
        opt_quant_1.use_winograd23_convolution = opt->use_winograd23_convolution;
        opt_quant_1.use_winograd43_convolution = opt->use_winograd43_convolution;
        opt_quant_1.use_winograd63_convolution = opt->use_winograd63_convolution;
        opt_quant_1.use_a53_a55_optimized_kernel = opt->use_a53_a55_optimized_kernel;
        opt_quant_1.use_fp16_uniform = opt->use_fp16_uniform;
        opt_quant_1.use_int8_uniform = opt->use_int8_uniform;
        opt_quant_1.use_reserved_9 = opt->use_reserved_9;
        opt_quant_1.use_reserved_10 = opt->use_reserved_10;
        opt_quant_1.use_reserved_11 = opt->use_reserved_11;
        opt_quant_1.blob_allocator = opt->workspace_allocator;
        opt_quant_1._32_8_ = uVar49 & 0xffffffffffffff;
        quantize_to_int8(hidden_state,(Mat *)&opt_quant,&local_168,&opt_quant_1);
      }
      pvVar43 = local_258.data;
      lVar52 = (long)(int)uVar66;
      fVar71 = 1.0 / *(float *)((long)local_c8.data + lVar52 * 4);
      fVar74 = 1.0 / *local_168.data;
      pvVar47 = bias_c->data;
      lVar51 = (long)bias_c->w * bias_c->elemsize;
      pvVar63 = weight_xc_int8->data;
      pvVar46 = weight_hc_int8->data;
      lVar58 = (long)weight_xc_int8->w * weight_xc_int8->elemsize;
      pvVar64 = (void *)(lVar58 * lVar48 + (long)pvVar63);
      pvVar69 = (void *)(lVar58 * lVar45 + (long)pvVar63);
      pvVar59 = (void *)(lVar58 * lVar44 + (long)pvVar63);
      lVar67 = (long)weight_hc_int8->w * weight_hc_int8->elemsize;
      pvVar65 = (void *)(lVar67 * lVar48 + (long)pvVar46);
      pvVar61 = (void *)(lVar67 * lVar45 + (long)pvVar46);
      pvVar53 = (void *)(lVar67 * lVar44 + (long)pvVar46);
      for (uVar49 = 0; uVar49 != uVar60; uVar49 = uVar49 + 1) {
        iVar75 = 0;
        iVar77 = 0;
        iVar78 = 0;
        iVar79 = 0;
        for (uVar62 = 0; uVar56 != uVar62; uVar62 = uVar62 + 1) {
          iVar54 = (int)*(char *)((long)local_118.data +
                                 uVar62 + local_118.w * lVar52 *
                                          CONCAT44(local_118.elemsize._4_4_,
                                                   (undefined4)local_118.elemsize));
          auVar86._4_4_ = iVar54;
          auVar86._0_4_ = iVar54;
          auVar86._8_4_ = iVar54;
          auVar86._12_4_ = iVar54;
          auVar84._8_8_ = 0;
          auVar84._0_8_ =
               (ulong)((uint)*(byte *)((long)pvVar63 + uVar62) << 8 |
                      (uint)*(byte *)((long)pvVar59 + uVar62) << 0x18) |
               (ulong)*(byte *)((long)pvVar69 + uVar62) << 0x28 |
               (ulong)*(byte *)((long)pvVar64 + uVar62) << 0x38;
          auVar84 = psraw(auVar84,8);
          auVar5._10_2_ = 0;
          auVar5._0_10_ = auVar84._0_10_;
          auVar5._12_2_ = auVar84._6_2_;
          auVar7._8_2_ = auVar84._4_2_;
          auVar7._0_8_ = auVar84._0_8_;
          auVar7._10_4_ = auVar5._10_4_;
          auVar41._6_8_ = 0;
          auVar41._0_6_ = auVar7._8_6_;
          auVar85._6_8_ = SUB148(auVar41 << 0x40,6);
          auVar85._4_2_ = auVar84._2_2_;
          auVar85._0_2_ = auVar84._0_2_;
          auVar85._2_2_ = 0;
          auVar85._14_2_ = 0;
          auVar86 = pmaddwd(auVar85,auVar86);
          iVar75 = iVar75 + auVar86._0_4_;
          iVar77 = iVar77 + auVar86._4_4_;
          iVar78 = iVar78 + auVar86._8_4_;
          iVar79 = iVar79 + auVar86._12_4_;
        }
        iVar54 = 0;
        iVar81 = 0;
        iVar82 = 0;
        iVar83 = 0;
        for (uVar62 = 0; uVar57 != uVar62; uVar62 = uVar62 + 1) {
          iVar55 = (int)*(char *)(opt_quant._0_8_ + uVar62);
          auVar87._4_4_ = iVar55;
          auVar87._0_4_ = iVar55;
          auVar87._8_4_ = iVar55;
          auVar87._12_4_ = iVar55;
          auVar88._8_8_ = 0;
          auVar88._0_8_ =
               (ulong)((uint)*(byte *)((long)pvVar46 + uVar62) << 8 |
                      (uint)*(byte *)((long)pvVar53 + uVar62) << 0x18) |
               (ulong)*(byte *)((long)pvVar61 + uVar62) << 0x28 |
               (ulong)*(byte *)((long)pvVar65 + uVar62) << 0x38;
          auVar86 = psraw(auVar88,8);
          auVar6._10_2_ = 0;
          auVar6._0_10_ = auVar86._0_10_;
          auVar6._12_2_ = auVar86._6_2_;
          auVar8._8_2_ = auVar86._4_2_;
          auVar8._0_8_ = auVar86._0_8_;
          auVar8._10_4_ = auVar6._10_4_;
          auVar42._6_8_ = 0;
          auVar42._0_6_ = auVar8._8_6_;
          auVar89._6_8_ = SUB148(auVar42 << 0x40,6);
          auVar89._4_2_ = auVar86._2_2_;
          auVar89._0_2_ = auVar86._0_2_;
          auVar89._2_2_ = 0;
          auVar89._14_2_ = 0;
          auVar86 = pmaddwd(auVar89,auVar87);
          iVar54 = iVar54 + auVar86._0_4_;
          iVar81 = iVar81 + auVar86._4_4_;
          iVar82 = iVar82 + auVar86._8_4_;
          iVar83 = iVar83 + auVar86._12_4_;
        }
        auVar76._0_4_ = (float)iVar75 * fVar71;
        auVar76._4_4_ = (float)iVar77 * fVar71;
        auVar76._8_4_ = (float)iVar78 * fVar71;
        auVar76._12_4_ = (float)iVar79 * fVar71;
        auVar80._0_4_ = (float)iVar54 * fVar74;
        auVar80._4_4_ = (float)iVar81 * fVar74;
        auVar80._8_4_ = (float)iVar82 * fVar74;
        auVar80._12_4_ = (float)iVar83 * fVar74;
        auVar4._4_4_ = weight_xc_int8_scales[uVar49 + lVar44];
        auVar4._0_4_ = weight_xc_int8_scales[uVar49];
        auVar4._8_4_ = weight_xc_int8_scales[uVar49 + lVar45];
        auVar4._12_4_ = weight_xc_int8_scales[lVar48 + uVar49];
        auVar86 = divps(auVar76,auVar4);
        auVar3._4_4_ = weight_hc_int8_scales[uVar49 + lVar44];
        auVar3._0_4_ = weight_hc_int8_scales[uVar49];
        auVar3._8_4_ = weight_hc_int8_scales[uVar49 + lVar45];
        auVar3._12_4_ = weight_hc_int8_scales[lVar48 + uVar49];
        auVar84 = divps(auVar80,auVar3);
        fVar73 = *(float *)((long)pvVar47 + uVar49 * 4 + lVar51 * 3);
        fVar72 = *(float *)((long)pvVar47 + uVar49 * 4 + lVar51 * 2);
        fVar1 = *(float *)((long)pvVar47 + uVar49 * 4 + lVar51);
        pfVar70 = (float *)((long)local_208.data +
                           (long)local_208.w *
                           CONCAT44(local_208.elemsize._4_4_,(undefined4)local_208.elemsize) *
                           uVar49);
        *pfVar70 = *(float *)((long)pvVar47 + uVar49 * 4) + auVar84._0_4_ + auVar86._0_4_;
        pfVar70[1] = fVar1 + auVar84._4_4_ + auVar86._4_4_;
        pfVar70[2] = fVar72 + auVar84._8_4_ + auVar86._8_4_;
        pfVar70[3] = fVar73 + auVar84._12_4_ + auVar86._12_4_;
        pvVar64 = (void *)((long)pvVar64 + lVar58);
        pvVar69 = (void *)((long)pvVar69 + lVar58);
        pvVar59 = (void *)((long)pvVar59 + lVar58);
        pvVar63 = (void *)((long)pvVar63 + lVar58);
        pvVar65 = (void *)((long)pvVar65 + lVar67);
        pvVar61 = (void *)((long)pvVar61 + lVar67);
        pvVar53 = (void *)((long)pvVar53 + lVar67);
        pvVar46 = (void *)((long)pvVar46 + lVar67);
      }
      pvVar46 = (void *)(top_blob->w * lVar52 * top_blob->elemsize + (long)top_blob->data);
      lVar52 = (long)local_208.w;
      lVar51 = CONCAT44(local_208.elemsize._4_4_,(undefined4)local_208.elemsize);
      pvVar47 = cell_state->data;
      pvVar63 = hidden_state->data;
      pfVar70 = (float *)((long)local_208.data + 0xc);
      for (uVar49 = 0; uVar60 != uVar49; uVar49 = uVar49 + 1) {
        fVar71 = *pfVar70;
        fVar74 = pfVar70[-2];
        fVar73 = pfVar70[-1];
        fVar72 = expf(-pfVar70[-3]);
        fVar74 = expf(-fVar74);
        fVar73 = expf(-fVar73);
        fVar71 = tanhf(fVar71);
        fVar71 = fVar71 / (fVar72 + 1.0) + *(float *)((long)pvVar47 + uVar49 * 4) / (fVar74 + 1.0);
        fVar74 = tanhf(fVar71);
        fVar74 = fVar74 / (fVar73 + 1.0);
        *(float *)((long)pvVar47 + uVar49 * 4) = fVar71;
        pvVar53 = pvVar43;
        if (_w == _h_00) {
          *(float *)((long)pvVar63 + uVar49 * 4) = fVar74;
          pvVar53 = pvVar46;
        }
        *(float *)((long)pvVar53 + uVar49 * 4) = fVar74;
        pfVar70 = (float *)((long)pfVar70 + lVar52 * lVar51);
      }
      if (_w != _h_00) {
        pvVar47 = weight_hr->data;
        iVar75 = weight_hr->w;
        sVar2 = weight_hr->elemsize;
        pvVar63 = hidden_state->data;
        for (uVar49 = 0; uVar49 != uVar57; uVar49 = uVar49 + 1) {
          fVar71 = 0.0;
          for (uVar62 = 0; uVar60 != uVar62; uVar62 = uVar62 + 1) {
            fVar71 = fVar71 + *(float *)((long)pvVar47 + uVar62 * 4) *
                              *(float *)((long)local_258.data + uVar62 * 4);
          }
          *(float *)((long)pvVar63 + uVar49 * 4) = fVar71;
          *(float *)((long)pvVar46 + uVar49 * 4) = fVar71;
          pvVar47 = (void *)((long)pvVar47 + (long)iVar75 * sVar2);
        }
      }
    }
    piVar40 = (int *)CONCAT44(local_168.refcount._4_4_,local_168.refcount._0_4_);
    if (piVar40 != (int *)0x0) {
      LOCK();
      *piVar40 = *piVar40 + -1;
      UNLOCK();
      if (*piVar40 == 0) {
        if (local_168.allocator == (Allocator *)0x0) {
          free(local_168.data);
        }
        else {
          (*(local_168.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    piVar40 = (int *)CONCAT44(opt_quant.blob_allocator._4_4_,opt_quant.blob_allocator._0_4_);
    if (piVar40 != (int *)0x0) {
      LOCK();
      *piVar40 = *piVar40 + -1;
      UNLOCK();
      if (*piVar40 == 0) {
        if (opt_quant._32_8_ == 0) {
          free((void *)opt_quant._0_8_);
        }
        else {
          (**(code **)(*(long *)opt_quant._32_8_ + 0x18))();
        }
      }
    }
    piVar40 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
    if (piVar40 != (int *)0x0) {
      LOCK();
      *piVar40 = *piVar40 + -1;
      UNLOCK();
      if (*piVar40 == 0) {
        if (local_c8.allocator == (Allocator *)0x0) {
          free(local_c8.data);
        }
        else {
          (*(local_c8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    piVar40 = (int *)CONCAT44(local_118.refcount._4_4_,local_118.refcount._0_4_);
    if (piVar40 != (int *)0x0) {
      LOCK();
      *piVar40 = *piVar40 + -1;
      UNLOCK();
      if (*piVar40 == 0) {
        if (local_118.allocator == (Allocator *)0x0) {
          free(local_118.data);
        }
        else {
          (*(local_118.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    iVar75 = 0;
  }
  else {
    Mat::create(&local_258,_h_00,4,opt->workspace_allocator);
    iVar75 = -100;
    if ((local_258.data != (void *)0x0) && ((long)local_258.c * local_258.cstep != 0))
    goto LAB_0032117a;
  }
  piVar40 = (int *)CONCAT44(local_258.refcount._4_4_,local_258.refcount._0_4_);
  if (piVar40 != (int *)0x0) {
    LOCK();
    *piVar40 = *piVar40 + -1;
    UNLOCK();
    if (*piVar40 == 0) {
      if (local_258.allocator == (Allocator *)0x0) {
        free(local_258.data);
      }
      else {
        (*(local_258.allocator)->_vptr_Allocator[3])();
      }
    }
  }
LAB_00321af5:
  piVar40 = (int *)CONCAT44(local_208.refcount._4_4_,local_208.refcount._0_4_);
  if (piVar40 != (int *)0x0) {
    LOCK();
    *piVar40 = *piVar40 + -1;
    UNLOCK();
    if (*piVar40 == 0) {
      if (local_208.allocator == (Allocator *)0x0) {
        free(local_208.data);
      }
      else {
        (*(local_208.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar75;
}

Assistant:

static int lstm_int8(const Mat& bottom_blob, Mat& top_blob, int reverse, const Mat& weight_xc_int8, const float* weight_xc_int8_scales, const Mat& bias_c, const Mat& weight_hc_int8, const float* weight_hc_int8_scales, const Mat& weight_hr, Mat& hidden_state, Mat& cell_state, const Option& opt)
{
    int size = bottom_blob.w;
    int T = bottom_blob.h;

    int num_output = top_blob.w;
    int hidden_size = cell_state.w;

    // 4 x hidden_size
    Mat gates(4, hidden_size, 4u, opt.workspace_allocator);
    if (gates.empty())
        return -100;

    Mat tmp_hidden_state;
    if (num_output != hidden_size)
    {
        tmp_hidden_state.create(hidden_size, 4u, opt.workspace_allocator);
        if (tmp_hidden_state.empty())
            return -100;
    }

    // dynamic quantize bottom_blob
    Mat bottom_blob_int8(size, T, (size_t)1u, 1, opt.workspace_allocator);
    Mat bottom_blob_int8_scales(T, (size_t)4u, 1, opt.workspace_allocator);
    {
        for (int t = 0; t < T; t++)
        {
            const float* x = bottom_blob.row(t);

            float absmax = 0.f;
            for (int i = 0; i < size; i++)
            {
                absmax = std::max(absmax, (float)fabs(x[i]));
            }

            bottom_blob_int8_scales[t] = 127.f / absmax;
        }

        Option opt_quant = opt;
        opt_quant.blob_allocator = opt.workspace_allocator;
        opt_quant.use_packing_layout = false;
        quantize_to_int8(bottom_blob, bottom_blob_int8, bottom_blob_int8_scales, opt_quant);
    }

    Mat hidden_state_int8(num_output, (size_t)1u, 1, opt.workspace_allocator);
    Mat hidden_state_int8_scales(1, (size_t)4u, 1, opt.workspace_allocator);

    // unroll
    for (int t = 0; t < T; t++)
    {
        // clip hidden by continuation indicator
        // h_cont_{t-1} = cont_t * h_{t-1}
        // h_cont_{t-1} = h_{t-1} if cont_t == 1
        //                0       otherwise
        // calculate hidden
        // gate_input_t := W_hc * h_conted_{t-1} + W_xc * x_t + b_c

        int ti = reverse ? T - 1 - t : t;

        // dynamic quantize hidden_state
        {
            float absmax = 0.f;
            for (int i = 0; i < num_output; i++)
            {
                absmax = std::max(absmax, (float)fabs(hidden_state[i]));
            }

            if (absmax == 0.f)
            {
                hidden_state_int8_scales[0] = 1.f;
                hidden_state_int8.fill<signed char>(0);
            }
            else
            {
                hidden_state_int8_scales[0] = 127.f / absmax;

                Option opt_quant = opt;
                opt_quant.blob_allocator = opt.workspace_allocator;
                opt_quant.use_packing_layout = false;
                quantize_to_int8(hidden_state, hidden_state_int8, hidden_state_int8_scales, opt_quant);
            }
        }

        const signed char* x = bottom_blob_int8.row<const signed char>(ti);
        const signed char* hs = hidden_state_int8;
        const float descale_x = 1.f / bottom_blob_int8_scales[ti];
        const float descale_h = 1.f / hidden_state_int8_scales[0];
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < hidden_size; q++)
        {
            const float* bias_c_I = bias_c.row(0);
            const float* bias_c_F = bias_c.row(1);
            const float* bias_c_O = bias_c.row(2);
            const float* bias_c_G = bias_c.row(3);

            float* gates_data = gates.row(q);

            // gate I F O G
            const signed char* weight_xc_int8_I = weight_xc_int8.row<const signed char>(hidden_size * 0 + q);
            const signed char* weight_xc_int8_F = weight_xc_int8.row<const signed char>(hidden_size * 1 + q);
            const signed char* weight_xc_int8_O = weight_xc_int8.row<const signed char>(hidden_size * 2 + q);
            const signed char* weight_xc_int8_G = weight_xc_int8.row<const signed char>(hidden_size * 3 + q);

            const signed char* weight_hc_int8_I = weight_hc_int8.row<const signed char>(hidden_size * 0 + q);
            const signed char* weight_hc_int8_F = weight_hc_int8.row<const signed char>(hidden_size * 1 + q);
            const signed char* weight_hc_int8_O = weight_hc_int8.row<const signed char>(hidden_size * 2 + q);
            const signed char* weight_hc_int8_G = weight_hc_int8.row<const signed char>(hidden_size * 3 + q);

            const float descale_xc_I = 1.f / weight_xc_int8_scales[hidden_size * 0 + q];
            const float descale_xc_F = 1.f / weight_xc_int8_scales[hidden_size * 1 + q];
            const float descale_xc_O = 1.f / weight_xc_int8_scales[hidden_size * 2 + q];
            const float descale_xc_G = 1.f / weight_xc_int8_scales[hidden_size * 3 + q];
            const float descale_hc_I = 1.f / weight_hc_int8_scales[hidden_size * 0 + q];
            const float descale_hc_F = 1.f / weight_hc_int8_scales[hidden_size * 1 + q];
            const float descale_hc_O = 1.f / weight_hc_int8_scales[hidden_size * 2 + q];
            const float descale_hc_G = 1.f / weight_hc_int8_scales[hidden_size * 3 + q];

            int Ix = 0;
            int Fx = 0;
            int Ox = 0;
            int Gx = 0;
            for (int i = 0; i < size; i++)
            {
                signed char xi = x[i];

                Ix += weight_xc_int8_I[i] * xi;
                Fx += weight_xc_int8_F[i] * xi;
                Ox += weight_xc_int8_O[i] * xi;
                Gx += weight_xc_int8_G[i] * xi;
            }

            int Ih = 0;
            int Fh = 0;
            int Oh = 0;
            int Gh = 0;
            for (int i = 0; i < num_output; i++)
            {
                signed char h_cont = hs[i];

                Ih += weight_hc_int8_I[i] * h_cont;
                Fh += weight_hc_int8_F[i] * h_cont;
                Oh += weight_hc_int8_O[i] * h_cont;
                Gh += weight_hc_int8_G[i] * h_cont;
            }

            float I = bias_c_I[q] + Ix * (descale_x * descale_xc_I) + Ih * (descale_h * descale_hc_I);
            float F = bias_c_F[q] + Fx * (descale_x * descale_xc_F) + Fh * (descale_h * descale_hc_F);
            float O = bias_c_O[q] + Ox * (descale_x * descale_xc_O) + Oh * (descale_h * descale_hc_O);
            float G = bias_c_G[q] + Gx * (descale_x * descale_xc_G) + Gh * (descale_h * descale_hc_G);

            gates_data[0] = I;
            gates_data[1] = F;
            gates_data[2] = O;
            gates_data[3] = G;
        }

        // lstm unit
        // sigmoid(I)
        // sigmoid(F)
        // sigmoid(O)
        // tanh(G)
        // c_t := f_t .* c_{t-1} + i_t .* g_t
        // h_t := o_t .* tanh[c_t]
        float* output_data = top_blob.row(ti);
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < hidden_size; q++)
        {
            const float* gates_data = gates.row(q);

            float I = gates_data[0];
            float F = gates_data[1];
            float O = gates_data[2];
            float G = gates_data[3];

            I = 1.f / (1.f + expf(-I));
            F = 1.f / (1.f + expf(-F));
            O = 1.f / (1.f + expf(-O));
            G = tanhf(G);

            float cell2 = F * cell_state[q] + I * G;
            float H = O * tanhf(cell2);
            cell_state[q] = cell2;

            if (num_output == hidden_size)
            {
                hidden_state[q] = H;
                output_data[q] = H;
            }
            else
            {
                tmp_hidden_state[q] = H;
            }
        }

        if (num_output != hidden_size)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < num_output; q++)
            {
                const float* hr = weight_hr.row(q);

                float H = 0;
                for (int i = 0; i < hidden_size; i++)
                {
                    H += tmp_hidden_state[i] * hr[i];
                }

                hidden_state[q] = H;
                output_data[q] = H;
            }
        }
    }

    return 0;
}